

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_ungrouped_aggregate.cpp
# Opt level: O2

ArenaAllocator * __thiscall
duckdb::GlobalUngroupedAggregateState::CreateAllocator(GlobalUngroupedAggregateState *this)

{
  reference this_00;
  type pAVar1;
  unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_> uStack_18;
  
  ::std::mutex::lock(&this->lock);
  make_uniq<duckdb::ArenaAllocator,duckdb::Allocator&>((duckdb *)&uStack_18,this->client_allocator);
  ::std::
  vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>,std::allocator<duckdb::unique_ptr<duckdb::ArenaAllocator,std::default_delete<duckdb::ArenaAllocator>,true>>>
              *)&this->stored_allocators,
             (unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>
              *)&uStack_18);
  ::std::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>_>::
  ~unique_ptr(&uStack_18);
  this_00 = vector<duckdb::unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>,_true>
            ::back(&this->stored_allocators);
  pAVar1 = unique_ptr<duckdb::ArenaAllocator,_std::default_delete<duckdb::ArenaAllocator>,_true>::
           operator*(this_00);
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return pAVar1;
}

Assistant:

ArenaAllocator &GlobalUngroupedAggregateState::CreateAllocator() const {
	lock_guard<mutex> glock(lock);
	stored_allocators.emplace_back(make_uniq<ArenaAllocator>(client_allocator));
	return *stored_allocators.back();
}